

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void * XML_GetBuffer(XML_Parser parser,int len)

{
  XML_Parsing XVar1;
  int iVar2;
  char *__dest;
  long local_d0;
  long local_c0;
  int local_a8;
  bool local_99;
  int local_98;
  int local_90;
  long local_88;
  long local_78;
  int local_68;
  int local_60;
  long local_50;
  int local_38;
  int local_34;
  int keep_1;
  int bufferSize;
  char *newBuf;
  int offset;
  int neededSize;
  int keep;
  int len_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local = (XML_Parser)0x0;
  }
  else if (len < 0) {
    parser->m_errorCode = XML_ERROR_NO_MEMORY;
    parser_local = (XML_Parser)0x0;
  }
  else {
    XVar1 = (parser->m_parsingStatus).parsing;
    if (XVar1 == XML_FINISHED) {
      parser->m_errorCode = XML_ERROR_FINISHED;
      parser_local = (XML_Parser)0x0;
    }
    else if (XVar1 == XML_SUSPENDED) {
      parser->m_errorCode = XML_ERROR_SUSPENDED;
      parser_local = (XML_Parser)0x0;
    }
    else {
      if ((parser->m_bufferLim == (char *)0x0) || (parser->m_bufferEnd == (char *)0x0)) {
        local_50 = 0;
      }
      else {
        local_50 = (long)parser->m_bufferLim - (long)parser->m_bufferEnd;
      }
      if (local_50 < len) {
        if ((parser->m_bufferEnd == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
          local_60 = 0;
        }
        else {
          local_60 = (int)parser->m_bufferEnd - (int)parser->m_bufferPtr;
        }
        if (len + local_60 < 0) {
          parser->m_errorCode = XML_ERROR_NO_MEMORY;
          return (void *)0x0;
        }
        if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
          local_68 = 0;
        }
        else {
          local_68 = (int)parser->m_bufferPtr - (int)parser->m_buffer;
        }
        offset = local_68;
        if (0x400 < local_68) {
          offset = 0x400;
        }
        iVar2 = offset + len + local_60;
        if ((parser->m_bufferLim == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
          local_78 = 0;
        }
        else {
          local_78 = (long)parser->m_bufferLim - (long)parser->m_buffer;
        }
        if (local_78 < iVar2) {
          if ((parser->m_bufferLim == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
            local_98 = 0;
          }
          else {
            local_98 = (int)parser->m_bufferLim - (int)parser->m_bufferPtr;
          }
          local_34 = local_98;
          if (local_98 == 0) {
            local_34 = 0x400;
          }
          do {
            local_34 = local_34 << 1;
            local_99 = local_34 < iVar2 && 0 < local_34;
          } while (local_99);
          if (local_34 < 1) {
            parser->m_errorCode = XML_ERROR_NO_MEMORY;
            return (void *)0x0;
          }
          __dest = (char *)(*(parser->m_mem).malloc_fcn)((long)local_34);
          if (__dest == (char *)0x0) {
            parser->m_errorCode = XML_ERROR_NO_MEMORY;
            return (void *)0x0;
          }
          parser->m_bufferLim = __dest + local_34;
          if (parser->m_bufferPtr == (char *)0x0) {
            parser->m_bufferEnd = __dest;
            parser->m_buffer = __dest;
            parser->m_bufferPtr = __dest;
          }
          else {
            if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
              local_a8 = 0;
            }
            else {
              local_a8 = (int)parser->m_bufferPtr - (int)parser->m_buffer;
            }
            local_38 = local_a8;
            if (0x400 < local_a8) {
              local_38 = 0x400;
            }
            if ((parser->m_bufferEnd == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
              local_c0 = 0;
            }
            else {
              local_c0 = (long)parser->m_bufferEnd - (long)parser->m_bufferPtr;
            }
            memcpy(__dest,parser->m_bufferPtr + -local_38,local_c0 + local_38);
            (*(parser->m_mem).free_fcn)(parser->m_buffer);
            parser->m_buffer = __dest;
            if ((parser->m_bufferEnd == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
              local_d0 = 0;
            }
            else {
              local_d0 = (long)parser->m_bufferEnd - (long)parser->m_bufferPtr;
            }
            parser->m_bufferEnd = parser->m_buffer + local_38 + local_d0;
            parser->m_bufferPtr = parser->m_buffer + local_38;
          }
        }
        else {
          if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
            local_88 = 0;
          }
          else {
            local_88 = (long)parser->m_bufferPtr - (long)parser->m_buffer;
          }
          if (offset < local_88) {
            if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
              local_90 = 0;
            }
            else {
              local_90 = (int)parser->m_bufferPtr - (int)parser->m_buffer;
            }
            local_90 = local_90 - offset;
            memmove(parser->m_buffer,parser->m_buffer + local_90,
                    (size_t)(parser->m_bufferEnd + ((long)offset - (long)parser->m_bufferPtr)));
            parser->m_bufferEnd = parser->m_bufferEnd + -(long)local_90;
            parser->m_bufferPtr = parser->m_bufferPtr + -(long)local_90;
          }
        }
        parser->m_eventEndPtr = (char *)0x0;
        parser->m_eventPtr = (char *)0x0;
        parser->m_positionPtr = (char *)0x0;
      }
      parser_local = (XML_Parser)parser->m_bufferEnd;
    }
  }
  return parser_local;
}

Assistant:

void * XMLCALL
XML_GetBuffer(XML_Parser parser, int len)
{
  if (parser == NULL)
    return NULL;
  if (len < 0) {
    parser->m_errorCode = XML_ERROR_NO_MEMORY;
    return NULL;
  }
  switch (parser->m_parsingStatus.parsing) {
  case XML_SUSPENDED:
    parser->m_errorCode = XML_ERROR_SUSPENDED;
    return NULL;
  case XML_FINISHED:
    parser->m_errorCode = XML_ERROR_FINISHED;
    return NULL;
  default: ;
  }

  if (len > EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferEnd)) {
#ifdef XML_CONTEXT_BYTES
    int keep;
#endif  /* defined XML_CONTEXT_BYTES */
    /* Do not invoke signed arithmetic overflow: */
    int neededSize = (int) ((unsigned)len +
                            (unsigned)EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd,
                                                          parser->m_bufferPtr));
    if (neededSize < 0) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return NULL;
    }
#ifdef XML_CONTEXT_BYTES
    keep = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
    if (keep > XML_CONTEXT_BYTES)
      keep = XML_CONTEXT_BYTES;
    neededSize += keep;
#endif  /* defined XML_CONTEXT_BYTES */
    if (neededSize <= EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_buffer)) {
#ifdef XML_CONTEXT_BYTES
      if (keep < EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer)) {
          int offset = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer) - keep;
        /* The buffer pointers cannot be NULL here; we have at least some bytes in the buffer */
        memmove(parser->m_buffer, &parser->m_buffer[offset], parser->m_bufferEnd - parser->m_bufferPtr + keep);
        parser->m_bufferEnd -= offset;
        parser->m_bufferPtr -= offset;
      }
#else
      if (parser->m_buffer && parser->m_bufferPtr) {
        memmove(parser->m_buffer, parser->m_bufferPtr,
                EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        parser->m_bufferEnd = parser->m_buffer +
            EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
        parser->m_bufferPtr = parser->m_buffer;
      }
#endif  /* not defined XML_CONTEXT_BYTES */
    }
    else {
      char *newBuf;
      int bufferSize = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferPtr);
      if (bufferSize == 0)
        bufferSize = INIT_BUFFER_SIZE;
      do {
        /* Do not invoke signed arithmetic overflow: */
        bufferSize = (int) (2U * (unsigned) bufferSize);
      } while (bufferSize < neededSize && bufferSize > 0);
      if (bufferSize <= 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      newBuf = (char *)MALLOC(parser, bufferSize);
      if (newBuf == 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      parser->m_bufferLim = newBuf + bufferSize;
#ifdef XML_CONTEXT_BYTES
      if (parser->m_bufferPtr) {
        int keep = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
        if (keep > XML_CONTEXT_BYTES)
          keep = XML_CONTEXT_BYTES;
        memcpy(newBuf, &parser->m_bufferPtr[-keep],
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr) + keep);
        FREE(parser, parser->m_buffer);
        parser->m_buffer = newBuf;
        parser->m_bufferEnd = parser->m_buffer +
            EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr) + keep;
        parser->m_bufferPtr = parser->m_buffer + keep;
      }
      else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
        parser->m_bufferPtr = parser->m_buffer = newBuf;
      }
#else
      if (parser->m_bufferPtr) {
        memcpy(newBuf, parser->m_bufferPtr,
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        FREE(parser, parser->m_buffer);
        parser->m_bufferEnd = newBuf +
            EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
      }
      else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
      }
      parser->m_bufferPtr = parser->m_buffer = newBuf;
#endif  /* not defined XML_CONTEXT_BYTES */
    }
    parser->m_eventPtr = parser->m_eventEndPtr = NULL;
    parser->m_positionPtr = NULL;
  }
  return parser->m_bufferEnd;
}